

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall google::protobuf::DescriptorPool::Tables::AddFile(Tables *this,FileDescriptor *file)

{
  pointer *pppcVar1;
  iterator __position;
  pair<std::__detail::_Node_iterator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false,_true>,_bool>
  pVar2;
  __node_gen_type __node_gen;
  char *local_30;
  FileDescriptor *local_28;
  FilesByNameMap *local_20;
  
  local_20 = &this->files_by_name_;
  local_30 = (char *)**(undefined8 **)file;
  local_28 = file;
  pVar2 = std::
          _Hashtable<char_const*,std::pair<char_const*const,google::protobuf::FileDescriptor_const*>,std::allocator<std::pair<char_const*const,google::protobuf::FileDescriptor_const*>>,std::__detail::_Select1st,google::protobuf::streq,google::protobuf::hash<char_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_insert<std::pair<char_const*const,google::protobuf::FileDescriptor_const*>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<char_const*const,google::protobuf::FileDescriptor_const*>,true>>>>
                    ();
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_30 = (char *)**(undefined8 **)file;
    __position._M_current =
         (this->files_after_checkpoint_).
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->files_after_checkpoint_).
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&this->files_after_checkpoint_,
                 __position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      pppcVar1 = &(this->files_after_checkpoint_).
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return (bool)(pVar2.second & 1);
}

Assistant:

bool DescriptorPool::Tables::AddFile(const FileDescriptor* file) {
  if (InsertIfNotPresent(&files_by_name_, file->name().c_str(), file)) {
    files_after_checkpoint_.push_back(file->name().c_str());
    return true;
  } else {
    return false;
  }
}